

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O2

int lj_ffh_string_rep(lua_State *L)

{
  uint uVar1;
  GCstr *pGVar2;
  GCstr *pGVar3;
  char *pcVar4;
  GCstr *pGVar5;
  ulong uVar6;
  ulong uVar7;
  int32_t i;
  uint uVar8;
  uint uVar9;
  TValue *pTVar10;
  uint32_t uVar11;
  SBuf *sb;
  long lVar12;
  size_t lenx;
  bool bVar13;
  
  pGVar2 = lj_lib_checkstr(L,1);
  uVar1 = lj_lib_checkint(L,2);
  pGVar3 = lj_lib_optstr(L,3);
  uVar9 = (L->glref).ptr32;
  if (0 < (int)uVar1) {
    uVar8 = pGVar2->len;
    if (pGVar3 == (GCstr *)0x0) {
      lenx = (long)(int)uVar8 * (ulong)uVar1;
    }
    else {
      lVar12 = (ulong)pGVar3->len + (long)(int)uVar8;
      if (0x7fffff00 < lVar12) goto LAB_0013cd53;
      lenx = lVar12 * (ulong)uVar1;
    }
    if (0x7fffff00 < (long)lenx) {
LAB_0013cd53:
      lj_err_caller(L,LJ_ERR_STROV);
    }
    if (lenx != 0) {
      sb = (SBuf *)((ulong)uVar9 + 0x58);
      pcVar4 = lj_str_needbuf(L,sb,(MSize)lenx);
      pGVar5 = pGVar2 + 1;
      uVar9 = uVar1;
      if ((pGVar3 != (GCstr *)0x0) && (lenx = lenx - pGVar3->len, uVar9 = 1, uVar1 != 1)) {
        uVar6 = 0;
        if (0 < (int)uVar8) {
          uVar6 = (ulong)uVar8;
        }
        while (bVar13 = uVar6 != 0, uVar6 = uVar6 - 1, bVar13) {
          *pcVar4 = (char)(pGVar5->nextgc).gcptr32;
          pcVar4 = pcVar4 + 1;
          pGVar5 = (GCstr *)((long)&(pGVar5->nextgc).gcptr32 + 1);
        }
        uVar8 = pGVar3->len;
        uVar7 = 0;
        uVar6 = 0;
        if (0 < (int)uVar8) {
          uVar6 = (ulong)uVar8;
        }
        for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
          pcVar4[uVar7] = *(char *)((long)&pGVar3[1].nextgc.gcptr32 + uVar7);
        }
        uVar8 = uVar8 + pGVar2->len;
        pGVar5 = (GCstr *)sb->buf;
        pcVar4 = pcVar4 + uVar7;
        uVar9 = uVar1 - 1;
      }
      do {
        lVar12 = 0;
        do {
          pcVar4[lVar12] = *(char *)((long)&(pGVar5->nextgc).gcptr32 + lVar12);
          lVar12 = lVar12 + 1;
        } while (lVar12 < (int)uVar8);
        pcVar4 = pcVar4 + lVar12;
        bVar13 = 1 < (int)uVar9;
        uVar9 = uVar9 - 1;
      } while (bVar13);
      pTVar10 = L->base;
      pGVar2 = lj_str_new(L,sb->buf,lenx);
      uVar11 = (uint32_t)pGVar2;
      goto LAB_0013cddb;
    }
  }
  pTVar10 = L->base;
  uVar11 = uVar9 + 0x80;
LAB_0013cddb:
  pTVar10[-1].u32.lo = uVar11;
  *(undefined4 *)((long)pTVar10 + -4) = 0xfffffffb;
  return 2;
}

Assistant:

LJLIB_ASM(string_rep)
{
  GCstr *s = lj_lib_checkstr(L, 1);
  int32_t k = lj_lib_checkint(L, 2);
  GCstr *sep = lj_lib_optstr(L, 3);
  int32_t len = (int32_t)s->len;
  global_State *g = G(L);
  int64_t tlen;
  const char *src;
  char *buf;
  if (k <= 0) {
  empty:
    setstrV(L, L->base-1, &g->strempty);
    return FFH_RES(1);
  }
  if (sep) {
    tlen = (int64_t)len + sep->len;
    if (tlen > LJ_MAX_STR)
      lj_err_caller(L, LJ_ERR_STROV);
    tlen *= k;
    if (tlen > LJ_MAX_STR)
      lj_err_caller(L, LJ_ERR_STROV);
  } else {
    tlen = (int64_t)k * len;
    if (tlen > LJ_MAX_STR)
      lj_err_caller(L, LJ_ERR_STROV);
  }
  if (tlen == 0) goto empty;
  buf = lj_str_needbuf(L, &g->tmpbuf, (MSize)tlen);
  src = strdata(s);
  if (sep) {
    tlen -= sep->len;  /* Ignore trailing separator. */
    if (k > 1) {  /* Paste one string and one separator. */
      int32_t i;
      i = 0; while (i < len) *buf++ = src[i++];
      src = strdata(sep); len = sep->len;
      i = 0; while (i < len) *buf++ = src[i++];
      src = g->tmpbuf.buf; len += s->len; k--;  /* Now copy that k-1 times. */
    }
  }
  do {
    int32_t i = 0;
    do { *buf++ = src[i++]; } while (i < len);
  } while (--k > 0);
  setstrV(L, L->base-1, lj_str_new(L, g->tmpbuf.buf, (size_t)tlen));
  return FFH_RES(1);
}